

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::ReadString(ON_BinaryArchive *this,ON_wString *s)

{
  unsigned_short *sUTF16;
  size_t sVar1;
  bool bVar2;
  uint sUTF32_count;
  uint uVar3;
  wchar_t *sUTF32;
  int iVar4;
  uint error_status;
  ON_SimpleArray<unsigned_short> utf16_buffer;
  size_t string_utf16_element_count;
  
  ON_wString::Destroy(s);
  string_utf16_element_count = 0;
  bVar2 = ReadStringUTF16ElementCount(this,&string_utf16_element_count);
  sVar1 = string_utf16_element_count;
  if (string_utf16_element_count == 0 || !bVar2) {
    return bVar2;
  }
  utf16_buffer._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080b130;
  utf16_buffer.m_a = (unsigned_short *)0x0;
  utf16_buffer.m_count = 0;
  utf16_buffer.m_capacity = 0;
  if (string_utf16_element_count << 0x20 != 0) {
    ON_SimpleArray<unsigned_short>::SetCapacity
              (&utf16_buffer,(long)(string_utf16_element_count << 0x20) >> 0x20);
  }
  bVar2 = ReadInt16(this,string_utf16_element_count,(ON__INT16 *)utf16_buffer.m_a);
  sUTF16 = utf16_buffer.m_a;
  if (bVar2) {
    iVar4 = (int)sVar1;
    if ((-1 < iVar4) && (iVar4 <= utf16_buffer.m_capacity)) {
      utf16_buffer.m_count = iVar4;
    }
    utf16_buffer.m_a[(long)iVar4 + -1] = 0;
    error_status = 0;
    sUTF32_count = ON_ConvertUTF16ToUTF32
                             (0,utf16_buffer.m_a,iVar4 + -1,(uint *)0x0,0,&error_status,0xffffffff,
                              0xfffd,(ON__UINT16 **)0x0);
    if (sUTF32_count == 0) {
LAB_00395ad3:
      ON_SimpleArray<unsigned_short>::~ON_SimpleArray(&utf16_buffer);
      return true;
    }
    if (0 < (int)sUTF32_count) {
      error_status = 0;
      ON_wString::ReserveArray(s,(ulong)(sUTF32_count + 1));
      sUTF32 = ON_wString::Array(s);
      uVar3 = ON_ConvertUTF16ToUTF32
                        (0,sUTF16,iVar4 + -1,(uint *)sUTF32,sUTF32_count,&error_status,0xffffffff,
                         0xfffd,(ON__UINT16 **)0x0);
      if (uVar3 == sUTF32_count) {
        ON_wString::SetLength(s,(ulong)sUTF32_count);
        goto LAB_00395ad3;
      }
    }
  }
  ON_SimpleArray<unsigned_short>::~ON_SimpleArray(&utf16_buffer);
  ON_wString::Destroy(s);
  return false;
}

Assistant:

bool
ON_BinaryArchive::ReadString( ON_wString& s )
{
#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_PUSH
// Disable the MSC /W4 "conditional expression is constant" warning
// about 2 == sizeof(wchar_t).  Since this code has to run on machines
// where sizeof(wchar_t) can be 2, 4, or 8 bytes, the test is necessary.
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4127 )
#endif

  s.Destroy();
  size_t string_utf16_element_count = 0;
  bool rc = ReadStringUTF16ElementCount( &string_utf16_element_count );
  if ( rc && string_utf16_element_count > 0 ) 
  {
    // string_utf16_element_count = number of ON__INT16 elements in
    // the string.  This is almost always the same as the
    // number of unicode code points. However, if one of
    // the code points happens to require two ON__INT16 
    // values to encode, then string_utf16_element_count will be 
    // larger than the number of unicode code points in 
    // the array.
    const int istring_utf16_element_count = (int)string_utf16_element_count;
    if ( 2 == sizeof(wchar_t) ) 
    {
      // When sizeof(wchar_t) is 2 bytes, assume wchar_t strings are 
      // UTF-16 encoded unicode strings.
      s.ReserveArray( istring_utf16_element_count );
      rc = ReadInt16( string_utf16_element_count, (ON__INT16*)s.Array() );
      if (rc)
        s.SetLength( istring_utf16_element_count-1 );
    }
    else if ( 4 == sizeof(wchar_t)  )
    {
      // When sizeof(wchar_t) is 4 bytes, assume wchar_t strings are 
      // UTF-32 encoded unicode strings. (some Apple CLang and GNU gcc implementations do this.)

      // Read the UTF-16 encode string from the file into
      // utf16_buffer[].
      ON_SimpleArray<ON__UINT16> utf16_buffer(istring_utf16_element_count);
      rc = ReadInt16(string_utf16_element_count,(ON__INT16*)utf16_buffer.Array());
      if(rc)
      {
        // convert to a UTF-32 encoded unicode string.
        utf16_buffer.SetCount(istring_utf16_element_count);
        utf16_buffer[istring_utf16_element_count-1] = 0;
        rc = false;
        const ON__UINT16* sUTF16 = utf16_buffer.Array();
        const int bTestByteOrder = false;
        const int sUTF16_count = istring_utf16_element_count-1;
        const ON__UINT32 error_code_point = 0xFFFD;
        const unsigned int error_mask = 0xFFFFFFFF;
        unsigned int error_status = 0;

        const int utf32_array_count = ON_ConvertUTF16ToUTF32(
            bTestByteOrder,
            sUTF16,
            sUTF16_count,
            0, // unsigned int* sUTF32
            0, // int sUTF32_count
            &error_status,
            error_mask,
            error_code_point,
            0 // const ON__UINT16** sNextUTF16
            );

        if ( 0 == utf32_array_count )
        {
          rc = true;
        }
        else if ( utf32_array_count > 0 )
        {
          error_status = 0;
          s.ReserveArray(utf32_array_count+1);
          const int utf32_array_count1 = ON_ConvertUTF16ToUTF32(
              bTestByteOrder,
              sUTF16,
              sUTF16_count,
              (unsigned int*)s.Array(), // unsigned int* sUTF32
              utf32_array_count, // sUTF32_count
              &error_status,
              error_mask,
              error_code_point,
              0 // const ON__UINT16** sNextUTF16
              );
          if ( utf32_array_count1 == utf32_array_count )
          {
            s.SetLength( utf32_array_count );
            rc = true;
          }
        }
      }
    }
    if (!rc)
      s.Destroy();
  }
  return rc;

#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_POP
#endif
}